

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O1

void TestAssign(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  char buffer [1024];
  Bignum bignum;
  Bignum bignum2;
  short local_828;
  char cStack_826;
  undefined1 uStack_825;
  undefined4 uStack_824;
  char local_820;
  undefined7 uStack_81f;
  char local_818;
  Bignum local_428;
  Bignum local_224;
  
  local_428.used_bigits_ = 0;
  local_428.exponent_ = 0;
  local_224.used_bigits_ = 0;
  local_224.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&local_428,0);
  bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
  if (!bVar1) {
    pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
    uVar3 = 0x38;
LAB_0081db2c:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar3,pcVar2);
    abort();
  }
  if (local_828 == 0x30) {
    double_conversion::Bignum::AssignUInt16(&local_428,10);
    bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
    if (!bVar1) {
      pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
      uVar3 = 0x3b;
      goto LAB_0081db2c;
    }
    if (local_828 == 0x41) {
      double_conversion::Bignum::AssignUInt16(&local_428,0x20);
      bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
      if (!bVar1) {
        pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
        uVar3 = 0x3e;
        goto LAB_0081db2c;
      }
      if (cStack_826 == '\0' && local_828 == 0x3032) {
        double_conversion::Bignum::AssignUInt64(&local_428,0);
        bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
        if (!bVar1) {
          pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
          uVar3 = 0x43;
          goto LAB_0081db2c;
        }
        if (local_828 == 0x30) {
          double_conversion::Bignum::AssignUInt64(&local_428,10);
          bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
          if (!bVar1) {
            pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
            uVar3 = 0x46;
            goto LAB_0081db2c;
          }
          if (local_828 == 0x41) {
            double_conversion::Bignum::AssignUInt64(&local_428,0x20);
            bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
            if (!bVar1) {
              pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
              uVar3 = 0x49;
              goto LAB_0081db2c;
            }
            if (cStack_826 == '\0' && local_828 == 0x3032) {
              double_conversion::Bignum::AssignUInt64(&local_428,0x100);
              bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
              if (!bVar1) {
                pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                uVar3 = 0x4c;
                goto LAB_0081db2c;
              }
              if (CONCAT13(uStack_825,CONCAT12(cStack_826,local_828)) == 0x303031) {
                double_conversion::Bignum::AssignUInt64(&local_428,0x12345678);
                bVar1 = double_conversion::Bignum::ToHexString(&local_428,(char *)&local_828,0x400);
                if (!bVar1) {
                  pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                  uVar3 = 0x51;
                  goto LAB_0081db2c;
                }
                if (local_820 == '\0' &&
                    CONCAT44(uStack_824,CONCAT13(uStack_825,CONCAT12(cStack_826,local_828))) ==
                    0x3837363534333231) {
                  double_conversion::Bignum::AssignUInt64(&local_428,0xffffffffffffffff);
                  bVar1 = double_conversion::Bignum::ToHexString
                                    (&local_428,(char *)&local_828,0x400);
                  if (!bVar1) {
                    pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                    uVar3 = 0x56;
                    goto LAB_0081db2c;
                  }
                  if ((local_818 == '\0' &&
                      CONCAT44(uStack_824,CONCAT13(uStack_825,CONCAT12(cStack_826,local_828))) ==
                      0x4646464646464646) && CONCAT71(uStack_81f,local_820) == 0x4646464646464646) {
                    double_conversion::Bignum::AssignUInt64(&local_428,0x123456789abcdef0);
                    bVar1 = double_conversion::Bignum::ToHexString
                                      (&local_428,(char *)&local_828,0x400);
                    if (!bVar1) {
                      pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                      uVar3 = 0x5b;
                      goto LAB_0081db2c;
                    }
                    if ((local_818 == '\0' &&
                        CONCAT44(uStack_824,CONCAT13(uStack_825,CONCAT12(cStack_826,local_828))) ==
                        0x3837363534333231) && CONCAT71(uStack_81f,local_820) == 0x3046454443424139)
                    {
                      double_conversion::Bignum::AssignBignum(&local_224,&local_428);
                      bVar1 = double_conversion::Bignum::ToHexString
                                        (&local_224,(char *)&local_828,0x400);
                      if (!bVar1) {
                        pcVar2 = "bignum2.ToHexString(buffer, kBufferSize)";
                        uVar3 = 0x5f;
                        goto LAB_0081db2c;
                      }
                      if ((local_818 == '\0' &&
                          CONCAT44(uStack_824,CONCAT13(uStack_825,CONCAT12(cStack_826,local_828)))
                          == 0x3837363534333231) &&
                          CONCAT71(uStack_81f,local_820) == 0x3046454443424139) {
                        value._8_8_ = 1;
                        value.start_ = "0";
                        double_conversion::Bignum::AssignDecimalString(&local_428,value);
                        bVar1 = double_conversion::Bignum::ToHexString
                                          (&local_428,(char *)&local_828,0x400);
                        if (!bVar1) {
                          pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                          uVar3 = 99;
                          goto LAB_0081db2c;
                        }
                        if (local_828 == 0x30) {
                          value_00._8_8_ = 1;
                          value_00.start_ = "1";
                          double_conversion::Bignum::AssignDecimalString(&local_428,value_00);
                          bVar1 = double_conversion::Bignum::ToHexString
                                            (&local_428,(char *)&local_828,0x400);
                          if (!bVar1) {
                            pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                            uVar3 = 0x67;
                            goto LAB_0081db2c;
                          }
                          if (local_828 == 0x31) {
                            value_01._8_8_ = 10;
                            value_01.start_ = "1234567890";
                            double_conversion::Bignum::AssignDecimalString(&local_428,value_01);
                            bVar1 = double_conversion::Bignum::ToHexString
                                              (&local_428,(char *)&local_828,0x400);
                            if (!bVar1) {
                              pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                              uVar3 = 0x6b;
                              goto LAB_0081db2c;
                            }
                            if (local_820 == '\0' &&
                                CONCAT44(uStack_824,
                                         CONCAT13(uStack_825,CONCAT12(cStack_826,local_828))) ==
                                0x3244323036393934) {
                              value_02._8_8_ = 1;
                              value_02.start_ = "0";
                              double_conversion::Bignum::AssignHexString(&local_428,value_02);
                              bVar1 = double_conversion::Bignum::ToHexString
                                                (&local_428,(char *)&local_828,0x400);
                              if (!bVar1) {
                                pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                                uVar3 = 0x6f;
                                goto LAB_0081db2c;
                              }
                              if (local_828 == 0x30) {
                                value_03._8_8_ = 0x10;
                                value_03.start_ = "123456789ABCDEF0";
                                double_conversion::Bignum::AssignHexString(&local_428,value_03);
                                bVar1 = double_conversion::Bignum::ToHexString
                                                  (&local_428,(char *)&local_828,0x400);
                                if (!bVar1) {
                                  pcVar2 = "bignum.ToHexString(buffer, kBufferSize)";
                                  uVar3 = 0x73;
                                  goto LAB_0081db2c;
                                }
                                if ((local_818 == '\0' &&
                                    CONCAT44(uStack_824,
                                             CONCAT13(uStack_825,CONCAT12(cStack_826,local_828))) ==
                                    0x3837363534333231) &&
                                    CONCAT71(uStack_81f,local_820) == 0x3046454443424139) {
                                  return;
                                }
                                pcVar2 = "\"123456789ABCDEF0\"";
                                pcVar4 = "123456789ABCDEF0";
                                uVar3 = 0x74;
                              }
                              else {
                                pcVar2 = "\"0\"";
                                pcVar4 = "0";
                                uVar3 = 0x70;
                              }
                            }
                            else {
                              pcVar2 = "\"499602D2\"";
                              pcVar4 = "499602D2";
                              uVar3 = 0x6c;
                            }
                          }
                          else {
                            pcVar2 = "\"1\"";
                            pcVar4 = "1";
                            uVar3 = 0x68;
                          }
                        }
                        else {
                          pcVar2 = "\"0\"";
                          pcVar4 = "0";
                          uVar3 = 100;
                        }
                      }
                      else {
                        pcVar2 = "\"123456789ABCDEF0\"";
                        pcVar4 = "123456789ABCDEF0";
                        uVar3 = 0x60;
                      }
                    }
                    else {
                      pcVar2 = "\"123456789ABCDEF0\"";
                      pcVar4 = "123456789ABCDEF0";
                      uVar3 = 0x5c;
                    }
                  }
                  else {
                    pcVar2 = "\"FFFFFFFFFFFFFFFF\"";
                    pcVar4 = "FFFFFFFFFFFFFFFF";
                    uVar3 = 0x57;
                  }
                }
                else {
                  pcVar2 = "\"12345678\"";
                  pcVar4 = "12345678";
                  uVar3 = 0x52;
                }
              }
              else {
                pcVar2 = "\"100\"";
                pcVar4 = "100";
                uVar3 = 0x4d;
              }
            }
            else {
              pcVar2 = "\"20\"";
              pcVar4 = "20";
              uVar3 = 0x4a;
            }
          }
          else {
            pcVar2 = "\"A\"";
            pcVar4 = "A";
            uVar3 = 0x47;
          }
        }
        else {
          pcVar2 = "\"0\"";
          pcVar4 = "0";
          uVar3 = 0x44;
        }
      }
      else {
        pcVar2 = "\"20\"";
        pcVar4 = "20";
        uVar3 = 0x3f;
      }
    }
    else {
      pcVar2 = "\"A\"";
      pcVar4 = "A";
      uVar3 = 0x3c;
    }
  }
  else {
    pcVar2 = "\"0\"";
    pcVar4 = "0";
    uVar3 = 0x39;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar3,pcVar2,"buffer",pcVar4,&local_828);
  abort();
}

Assistant:

TEST(Assign) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum bignum2;
  bignum.AssignUInt16(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt16(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt16(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);


  bignum.AssignUInt64(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt64(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);
  bignum.AssignUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100", buffer);

  // The first real test, since this will not fit into one bigit.
  bignum.AssignUInt64(0x12345678);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("12345678", buffer);

  uint64_t big = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFF", buffer);

  big = DOUBLE_CONVERSION_UINT64_2PART_C(0x12345678, 9ABCDEF0);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  bignum2.AssignBignum(bignum);
  CHECK(bignum2.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  AssignDecimalString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignDecimalString(&bignum, "1");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  AssignDecimalString(&bignum, "1234567890");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("499602D2", buffer);

  AssignHexString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "123456789ABCDEF0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);
}